

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

string * __thiscall
pbrt::DebugMLTSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,DebugMLTSampler *this)

{
  string local_40;
  
  MLTSampler::ToString_abi_cxx11_(&local_40,&this->super_MLTSampler);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<std::__cxx11::string,std::vector<float,std::allocator<float>>const&>
            (__return_storage_ptr__,"[ DebugMLTSampler %s u: %s ]",&local_40,&this->u);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ DebugMLTSampler %s u: %s ]",
                            ((const MLTSampler *)this)->ToString(), u);
    }